

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samples.cpp
# Opt level: O0

void __thiscall
pbrt::WavefrontPathIntegrator::GenerateRaySamples<pbrt::HaltonSampler>
          (WavefrontPathIntegrator *this,int wavefrontDepth,int sampleIndex)

{
  int in_ESI;
  WavefrontPathIntegrator *in_RDI;
  RayQueue *rayQueue;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  anon_class_16_2_36405375 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  WorkQueue<pbrt::RayWorkItem> *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  HaltonSampler::Name();
  std::operator+(__lhs,&in_RDI->initializeVisibleSurface);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  CurrentRayQueue(in_RDI,in_ESI);
  std::__cxx11::string::c_str();
  ForAllQueued<pbrt::WavefrontPathIntegrator::GenerateRaySamples<pbrt::HaltonSampler>(int,int)::_lambda(pbrt::RayWorkItem)_1_,pbrt::RayWorkItem>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void WavefrontPathIntegrator::GenerateRaySamples(int wavefrontDepth, int sampleIndex) {
    // Generate description string _desc_ for ray sample generation
    std::string desc = std::string("Generate ray samples - ") + ConcreteSampler::Name();

    RayQueue *rayQueue = CurrentRayQueue(wavefrontDepth);
    ForAllQueued(
        desc.c_str(), rayQueue, maxQueueSize, PBRT_CPU_GPU_LAMBDA(const RayWorkItem w) {
            // Generate samples for ray segment at current sample index
            // Find first sample dimension
            int dimension = 6 + 7 * w.depth;
            if (haveSubsurface)
                dimension += 3 * w.depth;

            // Initialize _Sampler_ for pixel, sample index, and dimension
            ConcreteSampler pixelSampler = *sampler.Cast<ConcreteSampler>();
            Point2i pPixel = pixelSampleState.pPixel[w.pixelIndex];
            pixelSampler.StartPixelSample(pPixel, sampleIndex, dimension);

            // Initialize _RaySamples_ structure with sample values
            RaySamples rs;
            rs.direct.uc = pixelSampler.Get1D();
            rs.direct.u = pixelSampler.Get2D();
            // Initialize remaining samples in _rs_
            rs.indirect.uc = pixelSampler.Get1D();
            rs.indirect.u = pixelSampler.Get2D();
            rs.indirect.rr = pixelSampler.Get1D();
            // Possibly initialize subsurface subsurface samples in _rs_
            rs.haveSubsurface = haveSubsurface;
            if (haveSubsurface) {
                rs.subsurface.uc = pixelSampler.Get1D();
                rs.subsurface.u = pixelSampler.Get2D();
            }

            // Store _RaySamples_ in pixel sample state
            pixelSampleState.samples[w.pixelIndex] = rs;
        });
}